

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithBoxes(Gia_Man_t *p,int fSeq)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *p_01;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  void *pvVar11;
  Gia_Man_t *pGVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int local_54;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar1 = Gia_ManBoxNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManBoxNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x84,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  Gia_ManMarkSeqGiaWithBoxes(p,fSeq);
  p_01 = Gia_ManStart(p->nObjs);
  pcVar8 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar8;
  pcVar8 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar8;
  p->pObjs->Value = 0;
  iVar1 = 1;
  while ((iVar1 < p->nObjs && (pGVar9 = Gia_ManObj(p,iVar1), pGVar9 != (Gia_Obj_t *)0x0))) {
    iVar2 = Gia_ObjIsTravIdCurrent(p,pGVar9);
    if (iVar2 != 0) {
      uVar3 = (uint)*(ulong *)pGVar9;
      if ((~uVar3 & 0x9fffffff) == 0) {
        uVar3 = Gia_ManAppendCi(p_01);
      }
      else {
        uVar13 = *(ulong *)pGVar9 & 0x1fffffff;
        if (uVar13 == 0x1fffffff || (int)uVar3 < 0) {
          if ((-1 < (int)uVar3) || ((int)uVar13 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                          ,0x96,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
          }
          iVar2 = Gia_ObjFanin0Copy(pGVar9);
          uVar3 = Gia_ManAppendCo(p_01,iVar2);
        }
        else {
          iVar2 = Gia_ObjFanin0Copy(pGVar9);
          iVar4 = Gia_ObjFanin1Copy(pGVar9);
          uVar3 = Gia_ManAppendAnd(p_01,iVar2,iVar4);
        }
      }
      pGVar9->Value = uVar3;
    }
    iVar1 = iVar1 + 1;
  }
  iVar1 = Gia_ManHasDangling(p_01);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ManHasDangling(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x98,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  if (fSeq == 0) {
    if (p->vRegClasses != (Vec_Int_t *)0x0) {
      pVVar10 = Vec_IntDup(p->vRegClasses);
      p_01->vRegClasses = pVVar10;
    }
    if (p->vRegInits != (Vec_Int_t *)0x0) {
      pVVar10 = Vec_IntDup(p->vRegInits);
      p_01->vRegInits = pVVar10;
    }
  }
  else {
    iVar1 = Gia_ManRegBoxNum(p);
    pVVar10 = Vec_IntAlloc(iVar1);
    p_01->vRegClasses = pVVar10;
    if (p->vRegInits != (Vec_Int_t *)0x0) {
      iVar1 = Gia_ManRegBoxNum(p);
      pVVar10 = Vec_IntAlloc(iVar1);
      p_01->vRegInits = pVVar10;
    }
    iVar1 = p->vCos->nSize;
    iVar2 = p->nRegs;
    iVar4 = Gia_ManRegBoxNum(p);
    for (iVar14 = 0; iVar5 = Gia_ManRegBoxNum(p), iVar14 < iVar5; iVar14 = iVar14 + 1) {
      pGVar9 = Gia_ManCo(p,(iVar1 - (iVar4 + iVar2)) + iVar14);
      iVar5 = Gia_ObjIsTravIdCurrent(p,pGVar9);
      if (iVar5 != 0) {
        pVVar10 = p_01->vRegClasses;
        iVar5 = Vec_IntEntry(p->vRegClasses,iVar14);
        Vec_IntPush(pVVar10,iVar5);
        if (p->vRegInits != (Vec_Int_t *)0x0) {
          pVVar10 = p_01->vRegInits;
          iVar5 = Vec_IntEntry(p->vRegInits,iVar14);
          Vec_IntPush(pVVar10,iVar5);
        }
      }
    }
  }
  iVar1 = Gia_ManBoxNum(p);
  pVVar10 = Vec_IntAlloc(iVar1);
  local_54 = Tim_ManPiNum(p_00);
  iVar1 = 0;
  for (iVar2 = 0; iVar4 = Gia_ManBoxNum(p), iVar2 < iVar4; iVar2 = iVar2 + 1) {
    iVar5 = Tim_ManBoxInputNum(p_00,iVar2);
    iVar6 = Tim_ManBoxOutputNum(p_00,iVar2);
    iVar15 = 0;
    iVar4 = 0;
    iVar14 = iVar1;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    while (iVar4 != 0) {
      pGVar9 = Gia_ManCo(p,iVar14);
      iVar7 = Gia_ObjIsTravIdCurrent(p,pGVar9);
      iVar15 = iVar15 + iVar7;
      iVar4 = iVar4 + -1;
      iVar14 = iVar14 + 1;
    }
    iVar4 = local_54;
    iVar14 = 0;
    if (0 < iVar6) {
      iVar14 = iVar6;
    }
    while (iVar14 != 0) {
      pGVar9 = Gia_ManCi(p,iVar4);
      iVar7 = Gia_ObjIsTravIdCurrent(p,pGVar9);
      iVar15 = iVar15 + iVar7;
      iVar4 = iVar4 + 1;
      iVar14 = iVar14 + -1;
    }
    if (iVar15 != iVar6 + iVar5 && iVar15 != 0) {
      __assert_fail("nMarked == 0 || nMarked == nBoxIns + nBoxOuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                    ,0xbf,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
    }
    if (iVar15 != 0) {
      Vec_IntPush(pVVar10,iVar2);
    }
    iVar1 = iVar5 + iVar1;
    local_54 = iVar6 + local_54;
  }
  iVar2 = Tim_ManPoNum(p_00);
  if (local_54 != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xc4,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  if (iVar2 + iVar1 != p->vCos->nSize) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xc5,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ManRegBoxNum(p);
  iVar2 = Gia_ManRegBoxNum(p_01);
  pvVar11 = Gia_ManUpdateTimMan2(p,pVVar10,iVar1 - iVar2);
  p_01->pManTime = pvVar11;
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xc9,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  if (p_01->pAigExtra != (Gia_Man_t *)0x0) {
    __assert_fail("pNew->pAigExtra == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xca,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  pGVar12 = Gia_ManUpdateExtraAig2(p->pManTime,p->pAigExtra,pVVar10);
  p_01->pAigExtra = pGVar12;
  iVar1 = p_01->vCis->nSize;
  iVar2 = Tim_ManPiNum((Tim_Man_t *)p_01->pManTime);
  if (iVar1 != iVar2 + p_01->pAigExtra->vCos->nSize) {
    __assert_fail("Gia_ManCiNum(pNew) == Tim_ManPiNum((Tim_Man_t*)pNew->pManTime) + Gia_ManCoNum(pNew->pAigExtra)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0xcc,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  Vec_IntFree(pVVar10);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupWithBoxes( Gia_Man_t * p, int fSeq )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vBoxesLeft;
    int curCi, curCo, nBoxIns, nBoxOuts;
    int i, k, iShift, nMarked;
    assert( Gia_ManBoxNum(p) > 0 );
    // mark useful boxes
    Gia_ManMarkSeqGiaWithBoxes( p, fSeq );
    // duplicate marked entries
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    assert( !Gia_ManHasDangling(pNew) );
    // collect remaining flops
    if ( fSeq )
    {
        pNew->vRegClasses = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
        if ( p->vRegInits )
            pNew->vRegInits = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
        iShift = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p);
        for ( i = 0; i < Gia_ManRegBoxNum(p); i++ )
            if ( Gia_ObjIsTravIdCurrent(p, Gia_ManCo(p, iShift + i)) )
            {
                Vec_IntPush( pNew->vRegClasses, Vec_IntEntry(p->vRegClasses, i) );
                if ( p->vRegInits )
                    Vec_IntPush( pNew->vRegInits, Vec_IntEntry(p->vRegInits, i) );
            }
    }
    else 
    {
        if ( p->vRegClasses )
            pNew->vRegClasses = Vec_IntDup( p->vRegClasses );
        if ( p->vRegInits )
            pNew->vRegInits = Vec_IntDup( p->vRegInits );
    }
    // collect remaining boxes
    vBoxesLeft = Vec_IntAlloc( Gia_ManBoxNum(p) );
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Gia_ManBoxNum(p); i++ )
    {
        nBoxIns = Tim_ManBoxInputNum(pManTime, i);
        nBoxOuts = Tim_ManBoxOutputNum(pManTime, i);
        nMarked = 0;
        for ( k = 0; k < nBoxIns; k++ )
            nMarked += Gia_ObjIsTravIdCurrent( p, Gia_ManCo(p, curCo + k) );
        for ( k = 0; k < nBoxOuts; k++ )
            nMarked += Gia_ObjIsTravIdCurrent( p, Gia_ManCi(p, curCi + k) );
        curCo += nBoxIns;
        curCi += nBoxOuts;
        // check presence
        assert( nMarked == 0 || nMarked == nBoxIns + nBoxOuts );
        if ( nMarked )
            Vec_IntPush( vBoxesLeft, i );
    }
    curCo += Tim_ManPoNum(pManTime);
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    // update timing manager
    pNew->pManTime = Gia_ManUpdateTimMan2( p, vBoxesLeft, Gia_ManRegBoxNum(p) - Gia_ManRegBoxNum(pNew) );
    // update extra STG
    assert( p->pAigExtra != NULL );
    assert( pNew->pAigExtra == NULL );
    pNew->pAigExtra = Gia_ManUpdateExtraAig2( p->pManTime, p->pAigExtra, vBoxesLeft );
    assert( Gia_ManCiNum(pNew) == Tim_ManPiNum((Tim_Man_t*)pNew->pManTime) + Gia_ManCoNum(pNew->pAigExtra) );
    Vec_IntFree( vBoxesLeft );
    return pNew;
}